

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzchangeel.cpp
# Opt level: O3

bool TPZChangeEl::NearestNode(TPZGeoEl *gel,TPZVec<double> *x,int64_t *meshNode,double tol)

{
  int iVar1;
  TPZGeoNode *this;
  int64_t iVar2;
  long lVar3;
  int i;
  bool bVar4;
  double dVar5;
  double dVar6;
  TPZVec<double> nodeCoord;
  TPZVec<double> local_50;
  
  *meshNode = -1;
  TPZVec<double>::TPZVec(&local_50,3);
  iVar1 = (**(code **)(*(long *)gel + 0x90))(gel);
  i = 0;
  if (iVar1 < 1) {
    bVar4 = false;
  }
  else {
    bVar4 = true;
    do {
      this = TPZGeoEl::NodePtr(gel,i);
      TPZGeoNode::GetCoordinates(this,&local_50);
      dVar5 = 0.0;
      lVar3 = 0;
      do {
        dVar6 = x->fStore[lVar3] - local_50.fStore[lVar3];
        dVar5 = dVar5 + dVar6 * dVar6;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      if (dVar5 <= tol) {
        iVar2 = (**(code **)(*(long *)gel + 0xa8))(gel,i);
        *meshNode = iVar2;
        break;
      }
      i = i + 1;
      bVar4 = i < iVar1;
    } while (i != iVar1);
  }
  local_50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  if (local_50.fStore != (double *)0x0) {
    operator_delete__(local_50.fStore);
  }
  return bVar4;
}

Assistant:

bool TPZChangeEl::NearestNode(TPZGeoEl * gel, TPZVec<REAL> &x, int64_t &meshNode, double tol)
{    
	meshNode = -1;
	bool IsNearSomeNode = false;
	
	TPZVec<REAL> nodeCoord(3);
	int nnodes = gel->NNodes();
	
	for(int n = 0; n < nnodes; n++)
	{
		double dist = 0.;
		gel->NodePtr(n)->GetCoordinates(nodeCoord);
		for(int c = 0; c < 3; c++)
		{
			dist += (x[c] - nodeCoord[c])*(x[c] - nodeCoord[c]);
		}
		dist = sqrt(dist);
		
		if(dist <= tol)
		{
			meshNode = gel->NodeIndex(n);
			IsNearSomeNode = true;
			break;
		}
	}
	
	return IsNearSomeNode;
}